

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  bool enabled_local;
  ImGuiCond flags_local;
  ImGuiWindow *window_local;
  
  if (enabled) {
    local_1c = (char)*(undefined4 *)&window->field_0xb4 | flags;
  }
  else {
    local_1c = (int)(char)*(undefined4 *)&window->field_0xb4 & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xb4 = *(uint *)&window->field_0xb4 & 0xffffff00 | local_1c & 0xff;
  if (enabled) {
    local_20 = (*(int *)&window->field_0xb4 << 0x10) >> 0x18 | flags;
  }
  else {
    local_20 = (*(int *)&window->field_0xb4 << 0x10) >> 0x18 & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xb4 = *(uint *)&window->field_0xb4 & 0xffff00ff | (local_20 & 0xff) << 8;
  if (enabled) {
    local_24 = (*(int *)&window->field_0xb4 << 8) >> 0x18 | flags;
  }
  else {
    local_24 = (*(int *)&window->field_0xb4 << 8) >> 0x18 & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xb4 =
       *(uint *)&window->field_0xb4 & 0xff00ffff | (local_24 & 0xff) << 0x10;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
}